

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

void allphone_backtrace(allphone_search_t *allphs,int32 f,int32 *out_score)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  undefined2 *ptr;
  glist_t pgVar5;
  int iVar6;
  int iVar7;
  int n;
  int32 n_00;
  int iVar8;
  int iVar9;
  
  allphone_clear_segments(allphs);
  iVar2 = allphs->history->n_valid;
  do {
    iVar1 = iVar2 + -1;
    if (iVar2 < 2) {
      iVar8 = f;
      if (iVar1 != 0) {
        return;
      }
      break;
    }
    pvVar3 = blkarray_list_get(allphs->history,iVar1);
    iVar8 = *(int *)((long)pvVar3 + 0x10);
    iVar2 = iVar1;
  } while (f < iVar8);
  iVar9 = -0x80000000;
  iVar2 = iVar8;
  n = -1;
  for (; (iVar2 == iVar8 && (0 < iVar1)); iVar1 = iVar1 + -1) {
    pvVar3 = blkarray_list_get(allphs->history,iVar1);
    iVar2 = *(int *)((long)pvVar3 + 0x10);
    iVar6 = *(int *)((long)pvVar3 + 8);
    iVar7 = iVar1;
    if (*(int *)((long)pvVar3 + 8) <= iVar9 || iVar2 != iVar8) {
      iVar6 = iVar9;
      iVar7 = n;
    }
    iVar9 = iVar6;
    n = iVar7;
  }
  if (-1 < n) {
    if (out_score != (int32 *)0x0) {
      *out_score = iVar9;
    }
    while (0 < n) {
      plVar4 = (long *)blkarray_list_get(allphs->history,n);
      ptr = (undefined2 *)
            __ckd_calloc__(1,0x14,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                           ,0x336);
      *ptr = *(undefined2 *)(*plVar4 + 0x5c);
      n_00 = *(int32 *)((long)plVar4 + 0x14);
      if (n_00 < 1) {
        iVar2 = 0;
      }
      else {
        pvVar3 = blkarray_list_get(allphs->history,n_00);
        iVar2 = *(int *)((long)pvVar3 + 0x10) + 1;
        n_00 = *(int32 *)((long)plVar4 + 0x14);
      }
      *(int *)(ptr + 2) = iVar2;
      *(int *)(ptr + 4) = (int)plVar4[2];
      iVar2 = (int)plVar4[1];
      if (0 < n_00) {
        pvVar3 = blkarray_list_get(allphs->history,n_00);
        iVar2 = iVar2 - *(int *)((long)pvVar3 + 8);
      }
      iVar1 = *(int *)((long)plVar4 + 0xc);
      *(int *)(ptr + 6) = iVar2 - iVar1;
      *(int *)(ptr + 8) = iVar1;
      pgVar5 = glist_add_ptr(allphs->segments,ptr);
      allphs->segments = pgVar5;
      n = *(int *)((long)plVar4 + 0x14);
    }
  }
  return;
}

Assistant:

static void
allphone_backtrace(allphone_search_t * allphs, int32 f, int32 *out_score)
{
    int32 best, hist_idx, best_idx;
    int32 frm, last_frm;
    history_t *h;
    phseg_t *s;

    /* Clear old list */
    allphone_clear_segments(allphs);

    frm = last_frm = f;
    /* Find the first history entry for the requested frame */
    hist_idx = blkarray_list_n_valid(allphs->history) - 1;
    while (hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        if (h->ef <= f) {
            frm = last_frm = h->ef;
            break;
        }
        hist_idx--;
    }

    if (hist_idx < 0)
        return;

    /* Find bestscore */
    best = MAX_NEG_INT32;
    best_idx = -1;
    while (frm == last_frm && hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        frm = h->ef;
        if (h->score > best && frm == last_frm) {
            best = h->score;
            best_idx = hist_idx;
        }
        hist_idx--;
    }

    if (best_idx < 0)
        return;

    if (out_score)
        *out_score = best;

    /* Backtrace */
    while (best_idx > 0) {
        h = blkarray_list_get(allphs->history, best_idx);
        s = (phseg_t *) ckd_calloc(1, sizeof(phseg_t));
        s->ci = h->phmm->ci;
        s->sf =
            (h->hist >
             0) ? ((history_t *) blkarray_list_get(allphs->history,
                                                   h->hist))->ef + 1 : 0;
        s->ef = h->ef;
        s->score = ascore(allphs, h);
        s->tscore = h->tscore;
        allphs->segments = glist_add_ptr(allphs->segments, s);

        best_idx = h->hist;
    }

    return;
}